

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wl_window.c
# Opt level: O2

void keyboardHandleEnter(void *userData,wl_keyboard *keyboard,uint32_t serial,wl_surface *surface,
                        wl_array *keys)

{
  char **ppcVar1;
  _GLFWwindow *window;
  
  if (surface != (wl_surface *)0x0) {
    ppcVar1 = (*_glfw.wl.client.proxy_get_tag)((wl_proxy *)surface);
    if (ppcVar1 == (char **)0x17b040) {
      window = (_GLFWwindow *)(*_glfw.wl.client.proxy_get_user_data)((wl_proxy *)surface);
      if ((window->wl).surface == surface) {
        _glfw.wl.serial = serial;
        _glfw.wl.keyboardFocus = window;
        _glfwInputWindowFocus(window,1);
        return;
      }
    }
  }
  return;
}

Assistant:

static void keyboardHandleEnter(void* userData,
                                struct wl_keyboard* keyboard,
                                uint32_t serial,
                                struct wl_surface* surface,
                                struct wl_array* keys)
{
    // Happens in the case we just destroyed the surface.
    if (!surface)
        return;

    if (wl_proxy_get_tag((struct wl_proxy*) surface) != &_glfw.wl.tag)
        return;

    _GLFWwindow* window = wl_surface_get_user_data(surface);
    if (surface != window->wl.surface)
        return;

    _glfw.wl.serial = serial;
    _glfw.wl.keyboardFocus = window;
    _glfwInputWindowFocus(window, GLFW_TRUE);
}